

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::fusedMultiplyAdd
          (IEEEFloat *this,IEEEFloat *multiplicand,IEEEFloat *addend,roundingMode rounding_mode)

{
  byte bVar1;
  lostFraction lost_fraction;
  opStatus oVar2;
  opStatus oVar3;
  
  bVar1 = this->field_0x12;
  this->field_0x12 = multiplicand->field_0x12 & 8 ^ bVar1;
  if ((((bVar1 & 7) == 3 || (bVar1 & 6) == 0) ||
      ((multiplicand->field_0x12 & 7) == 3 || (multiplicand->field_0x12 & 6) == 0)) ||
     ((addend->field_0x12 & 6) == 0)) {
    oVar2 = multiplySpecials(this,multiplicand);
    oVar3 = opInvalidOp;
    if (oVar2 == opOK) {
      oVar3 = addOrSubtract(this,addend,rounding_mode,false);
      return oVar3;
    }
  }
  else {
    lost_fraction = multiplySignificand(this,multiplicand,addend);
    oVar2 = normalize(this,rounding_mode,lost_fraction);
    oVar3 = oVar2 | opInexact;
    if (lost_fraction == lfExactlyZero) {
      oVar3 = oVar2;
    }
    bVar1 = this->field_0x12;
    if (((char)((oVar3 & opUnderflow) >> 3) == '\0' && (bVar1 & 7) == 3) &&
       (((addend->field_0x12 ^ bVar1) & 8) != 0)) {
      this->field_0x12 = bVar1 & 0xf3 | (rounding_mode == rmTowardNegative) << 3;
    }
  }
  return oVar3;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::fusedMultiplyAdd(const IEEEFloat &multiplicand,
                                                const IEEEFloat &addend,
                                                roundingMode rounding_mode) {
  opStatus fs;

  /* Post-multiplication sign, before addition.  */
  sign ^= multiplicand.sign;

  /* If and only if all arguments are normal do we need to do an
     extended-precision calculation.  */
  if (isFiniteNonZero() &&
      multiplicand.isFiniteNonZero() &&
      addend.isFinite()) {
    lostFraction lost_fraction;

    lost_fraction = multiplySignificand(multiplicand, &addend);
    fs = normalize(rounding_mode, lost_fraction);
    if (lost_fraction != lfExactlyZero)
      fs = (opStatus) (fs | opInexact);

    /* If two numbers add (exactly) to zero, IEEE 754 decrees it is a
       positive zero unless rounding to minus infinity, except that
       adding two like-signed zeroes gives that zero.  */
    if (category == fcZero && !(fs & opUnderflow) && sign != addend.sign)
      sign = (rounding_mode == rmTowardNegative);
  } else {
    fs = multiplySpecials(multiplicand);

    /* FS can only be opOK or opInvalidOp.  There is no more work
       to do in the latter case.  The IEEE-754R standard says it is
       implementation-defined in this case whether, if ADDEND is a
       quiet NaN, we raise invalid op; this implementation does so.

       If we need to do the addition we can do so with normal
       precision.  */
    if (fs == opOK)
      fs = addOrSubtract(addend, rounding_mode, false);
  }

  return fs;
}